

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O3

magic_realm * class_magic_realms(player_class *c,int *count)

{
  class_book *pcVar1;
  char *pcVar2;
  byte bVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined4 uVar7;
  byte bVar8;
  int iVar9;
  magic_realm *p;
  magic_realm *pmVar10;
  magic_realm *pmVar11;
  long lVar12;
  
  p = (magic_realm *)mem_zalloc(0x38);
  *count = 0;
  if ((c->magic).total_spells == L'\0') {
    mem_free(p);
    p = (magic_realm *)0x0;
  }
  else if (L'\0' < (c->magic).num_books) {
    lVar12 = 0;
    do {
      pcVar1 = (c->magic).books;
      pmVar11 = pcVar1[lVar12].realm;
      if (p->name == (char *)0x0) {
        pcVar2 = pmVar11->code;
        pcVar4 = pmVar11->name;
        iVar9 = pmVar11->stat;
        uVar7 = *(undefined4 *)&pmVar11->field_0x1c;
        pcVar5 = pmVar11->verb;
        pcVar6 = pmVar11->spell_noun;
        p->next = pmVar11->next;
        p->code = pcVar2;
        p->book_noun = pmVar11->book_noun;
        p->verb = pcVar5;
        p->spell_noun = pcVar6;
        p->name = pcVar4;
        p->stat = iVar9;
        *(undefined4 *)&p->field_0x1c = uVar7;
        p->next = (magic_realm *)0x0;
LAB_001a8355:
        *count = *count + 1;
      }
      else {
        pcVar2 = pmVar11->name;
        pmVar11 = p;
        bVar8 = 0;
        do {
          bVar3 = bVar8;
          iVar9 = strcmp(pmVar11->name,pcVar2);
          pmVar11 = pmVar11->next;
          bVar8 = bVar3 | iVar9 == 0;
        } while (pmVar11 != (magic_realm *)0x0);
        if (!(bool)(bVar3 | iVar9 == 0)) {
          pmVar10 = (magic_realm *)mem_zalloc(0x38);
          pmVar11 = pcVar1[lVar12].realm;
          pcVar2 = pmVar11->code;
          pcVar4 = pmVar11->name;
          iVar9 = pmVar11->stat;
          uVar7 = *(undefined4 *)&pmVar11->field_0x1c;
          pcVar5 = pmVar11->verb;
          pcVar6 = pmVar11->spell_noun;
          pmVar10->next = pmVar11->next;
          pmVar10->code = pcVar2;
          pmVar10->name = pcVar4;
          pmVar10->stat = iVar9;
          *(undefined4 *)&pmVar10->field_0x1c = uVar7;
          pmVar10->verb = pcVar5;
          pmVar10->spell_noun = pcVar6;
          pmVar10->book_noun = pmVar11->book_noun;
          pmVar10->next = p;
          p = pmVar10;
          goto LAB_001a8355;
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (c->magic).num_books);
  }
  return p;
}

Assistant:

struct magic_realm *class_magic_realms(const struct player_class *c, int *count)
{
	int i;
	struct magic_realm *r = mem_zalloc(sizeof(struct magic_realm));

	*count = 0;

	if (!c->magic.total_spells) {
		mem_free(r);
		return NULL;
	}

	for (i = 0; i < c->magic.num_books; i++) {
		struct magic_realm *r_test = r;
		struct class_book *book = &c->magic.books[i];
		bool found = false;

		/* Test for first realm */
		if (r->name == NULL) {
			memcpy(r, book->realm, sizeof(struct magic_realm));
			r->next = NULL;
			(*count)++;
			continue;
		}

		/* Test for already recorded */
		while (r_test) {
			if (streq(r_test->name, book->realm->name)) {
				found = true;
			}
			r_test = r_test->next;
		}
		if (found) continue;

		/* Add it */
		r_test = mem_zalloc(sizeof(struct magic_realm));
		memcpy(r_test, book->realm, sizeof(struct magic_realm));
		r_test->next = r;
		r = r_test;
		(*count)++;
	}

	return r;
}